

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O1

void __thiscall FS::StateStack::pop(StateStack *this)

{
  pointer paVar1;
  
  paVar1 = (this->stack).
           super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->stack).
  super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar1;
  if (10 < (ulong)(((long)paVar1 -
                    (long)(this->stack).
                          super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    push(this,ERROR_STATE,(StateArg)0x10600000001);
  }
  if ((this->stack).
      super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->stack).
      super__Vector_base<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  push(this,ERROR_STATE,(StateArg)0x10b00000001);
  return;
}

Assistant:

void pop( void )
  {
    stack.pop_back();
    if ( stack.size() > 10 ) 
    {
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
    if ( stack.empty() ) 
    {
      // bug, should never happen.
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
  }